

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpClient.cpp
# Opt level: O1

void __thiscall mario::TcpClient::~TcpClient(TcpClient *this)

{
  MutexLock *__mutex;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__r;
  EventLoop *pEVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Manager_type p_Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  TcpConnectionPtr conn;
  CloseCallback cb;
  undefined1 local_c8 [16];
  _Manager_type local_b8;
  _Invoker_type p_Stack_b0;
  code *local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  shared_ptr<mario::TcpConnection> local_88;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  local_88.super___shared_ptr<mario::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_88.super___shared_ptr<mario::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __mutex = &this->_mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  local_88.super___shared_ptr<mario::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->_connection).super___shared_ptr<mario::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  __r = &(this->_connection).super___shared_ptr<mario::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_88.super___shared_ptr<mario::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,__r);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  if (local_88.super___shared_ptr<mario::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    Connector::stop((this->_connector).
                    super___shared_ptr<mario::Connector,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    pEVar1 = this->_loop;
    peVar2 = (this->_connector).super___shared_ptr<mario::Connector,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var3 = (this->_connector).super___shared_ptr<mario::Connector,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
    }
    local_b8 = (_Manager_type)0x0;
    p_Stack_b0 = (_Invoker_type)0x0;
    local_c8._0_8_ = (void *)0x0;
    local_c8._8_8_ = 0;
    local_c8._0_8_ = operator_new(0x18);
    *(code **)local_c8._0_8_ = detail::removeConnector;
    *(element_type **)(local_c8._0_8_ + 8) = peVar2;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_c8._0_8_ + 0x10) = p_Var3;
    p_Stack_b0 = std::
                 _Function_handler<void_(),_std::_Bind<void_(*(std::shared_ptr<mario::Connector>))(const_std::shared_ptr<mario::Connector>_&)>_>
                 ::_M_invoke;
    local_b8 = std::
               _Function_handler<void_(),_std::_Bind<void_(*(std::shared_ptr<mario::Connector>))(const_std::shared_ptr<mario::Connector>_&)>_>
               ::_M_manager;
    EventLoop::runAfter(pEVar1,1.0,(TimerCallback *)local_c8);
    if (local_b8 != (_Manager_type)0x0) {
      (*local_b8)((_Any_data *)local_c8,(_Any_data *)local_c8,__destroy_functor);
    }
  }
  else {
    pEVar1 = this->_loop;
    local_48 = (code *)0x0;
    pcStack_40 = (code *)0x0;
    local_58._M_unused._M_object = (void *)0x0;
    local_58._8_8_ = 0;
    local_58._M_unused._M_object = operator_new(0x10);
    *(code **)local_58._M_unused._0_8_ = detail::removeConnection;
    *(EventLoop **)((long)local_58._M_unused._0_8_ + 8) = pEVar1;
    pcStack_40 = std::
                 _Function_handler<void_(const_std::shared_ptr<mario::TcpConnection>_&),_std::_Bind<void_(*(mario::EventLoop_*,_std::_Placeholder<1>))(mario::EventLoop_*,_const_std::shared_ptr<mario::TcpConnection>_&)>_>
                 ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(const_std::shared_ptr<mario::TcpConnection>_&),_std::_Bind<void_(*(mario::EventLoop_*,_std::_Placeholder<1>))(mario::EventLoop_*,_const_std::shared_ptr<mario::TcpConnection>_&)>_>
               ::_M_manager;
    local_c8._0_8_ = TcpConnection::setCloseCallback;
    local_c8._8_8_ = 0;
    std::
    _Tuple_impl<0ul,std::shared_ptr<mario::TcpConnection>,std::function<void(std::shared_ptr<mario::TcpConnection>const&)>>
    ::
    _Tuple_impl<std::shared_ptr<mario::TcpConnection>&,std::function<void(std::shared_ptr<mario::TcpConnection>const&)>&,void>
              ((_Tuple_impl<0ul,std::shared_ptr<mario::TcpConnection>,std::function<void(std::shared_ptr<mario::TcpConnection>const&)>>
                *)&local_b8,&local_88,
               (function<void_(const_std::shared_ptr<mario::TcpConnection>_&)> *)&local_58);
    local_68 = (code *)0x0;
    pcStack_60 = (code *)0x0;
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    local_78._M_unused._M_object = operator_new(0x40);
    p_Var3 = local_90;
    *(undefined8 *)local_78._M_unused._0_8_ = local_c8._0_8_;
    *(undefined8 *)((long)local_78._M_unused._0_8_ + 8) = local_c8._8_8_;
    *(undefined8 *)((long)local_78._M_unused._0_8_ + 0x10) = 0;
    *(undefined8 *)((long)local_78._M_unused._0_8_ + 0x18) = 0;
    *(undefined8 *)((long)local_78._M_unused._0_8_ + 0x20) = 0;
    *(undefined8 *)((long)local_78._M_unused._0_8_ + 0x28) = uStack_a0;
    if (local_a8 != (code *)0x0) {
      *(_Manager_type *)((long)local_78._M_unused._0_8_ + 0x10) = local_b8;
      *(_Invoker_type *)((long)local_78._M_unused._0_8_ + 0x18) = p_Stack_b0;
      *(code **)((long)local_78._M_unused._0_8_ + 0x20) = local_a8;
      local_a8 = (code *)0x0;
      uStack_a0 = 0;
    }
    *(undefined8 *)((long)local_78._M_unused._0_8_ + 0x30) = local_98;
    *(undefined8 *)((long)local_78._M_unused._0_8_ + 0x38) = 0;
    local_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_78._M_unused._0_8_ + 0x38) =
         p_Var3;
    local_98 = 0;
    pcStack_60 = std::
                 _Function_handler<void_(),_std::_Bind<void_(mario::TcpConnection::*(std::shared_ptr<mario::TcpConnection>,_std::function<void_(const_std::shared_ptr<mario::TcpConnection>_&)>))(const_std::function<void_(const_std::shared_ptr<mario::TcpConnection>_&)>_&)>_>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(),_std::_Bind<void_(mario::TcpConnection::*(std::shared_ptr<mario::TcpConnection>,_std::function<void_(const_std::shared_ptr<mario::TcpConnection>_&)>))(const_std::function<void_(const_std::shared_ptr<mario::TcpConnection>_&)>_&)>_>
               ::_M_manager;
    EventLoop::runInLoop(pEVar1,(Functor *)&local_78);
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,__destroy_functor);
    }
    if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
    }
    if (local_a8 != (code *)0x0) {
      (*local_a8)((_Tuple_impl<0ul,std::shared_ptr<mario::TcpConnection>,std::function<void(std::shared_ptr<mario::TcpConnection>const&)>>
                   *)&local_b8,
                  (_Tuple_impl<0ul,std::shared_ptr<mario::TcpConnection>,std::function<void(std::shared_ptr<mario::TcpConnection>const&)>>
                   *)&local_b8,3);
    }
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
  }
  if (local_88.super___shared_ptr<mario::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<mario::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  p_Var3 = __r->_M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  pthread_mutex_destroy((pthread_mutex_t *)__mutex);
  p_Var4 = (this->_messageCallback).super__Function_base._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    (*p_Var4)((_Any_data *)&this->_messageCallback,(_Any_data *)&this->_messageCallback,
              __destroy_functor);
  }
  p_Var4 = (this->_connectionCallback).super__Function_base._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    (*p_Var4)((_Any_data *)&this->_connectionCallback,(_Any_data *)&this->_connectionCallback,
              __destroy_functor);
  }
  p_Var3 = (this->_connector).super___shared_ptr<mario::Connector,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  return;
}

Assistant:

TcpClient::~TcpClient() {
    TcpConnectionPtr conn;
    {
        MutexLockGuard lock(_mutex);
        conn = _connection;
    }

    if (conn) {
        CloseCallback cb = std::bind(&detail::removeConnection, _loop, _1);
        _loop->runInLoop(
                std::bind(&TcpConnection::setCloseCallback, conn, cb)
                );
    } else {
        _connector->stop();
        _loop->runAfter(1, std::bind(&detail::removeConnector, _connector));
    }
}